

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

void __thiscall Fl_PostScript_Graphics_Driver::push_no_clip(Fl_PostScript_Graphics_Driver *this)

{
  Clip *pCVar1;
  
  pCVar1 = (Clip *)operator_new(0x18);
  pCVar1->x = 0;
  pCVar1->y = 0;
  pCVar1->w = 0;
  pCVar1->h = 0;
  pCVar1->prev = (Clip *)0x0;
  pCVar1->prev = this->clip_;
  this->clip_ = pCVar1;
  pCVar1->x = -1;
  pCVar1->y = -1;
  pCVar1->w = -1;
  pCVar1->h = -1;
  fwrite("CR\nCS\n",6,1,(FILE *)this->output);
  if (this->lang_level_ < 3) {
    recover(this);
    return;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::push_no_clip() {
  Clip * c = new Clip();
  c->prev=clip_;
  clip_=c;
  clip_->x = clip_->y = clip_->w = clip_->h = -1;
  fprintf(output, "CR\nCS\n");
  if(lang_level_<3)
    recover();
}